

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::
MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>
::operator()(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
            MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>
            *this,Entity *e,MatrixXd *local)

{
  vector<double,_std::allocator<double>_> local_30;
  
  fe::MeshFunctionFE<double,_double>::operator()(&local_30,&this->mf_,e,local);
  internal::UnaryOpSquaredNorm::operator()
            (__return_storage_ptr__,(UnaryOpSquaredNorm *)this,&local_30,0);
  if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const mesh::Entity& e, const Eigen::MatrixXd& local) const {
    return op_(mf_(e, local), 0);
  }